

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqarray.h
# Opt level: O1

bool __thiscall SQArray::Set(SQArray *this,SQInteger nidx,SQObjectPtr *val)

{
  SQUnsignedInteger *pSVar1;
  SQObjectPtr *pSVar2;
  SQObjectType SVar3;
  SQObjectPtr *pSVar4;
  SQTable *pSVar5;
  SQFloat SVar6;
  undefined4 uVar7;
  SQObjectFlags SVar8;
  undefined3 uVar9;
  ulong uVar10;
  ulong uVar11;
  
  uVar11 = (ulong)(this->_values)._size;
  if ((ulong)nidx < uVar11) {
    pSVar4 = (this->_values)._vals;
    uVar10 = nidx & 0xffffffff;
    SVar3 = pSVar4[uVar10].super_SQObject._type;
    pSVar5 = pSVar4[uVar10].super_SQObject._unVal.pTable;
    SVar8 = (val->super_SQObject)._flags;
    uVar9 = *(undefined3 *)&(val->super_SQObject).field_0x5;
    SVar6 = (val->super_SQObject)._unVal.fFloat;
    uVar7 = *(undefined4 *)((long)&(val->super_SQObject)._unVal + 4);
    pSVar2 = pSVar4 + uVar10;
    (pSVar2->super_SQObject)._type = (val->super_SQObject)._type;
    (pSVar2->super_SQObject)._flags = SVar8;
    *(undefined3 *)&(pSVar2->super_SQObject).field_0x5 = uVar9;
    (pSVar2->super_SQObject)._unVal.fFloat = SVar6;
    *(undefined4 *)((long)&(pSVar2->super_SQObject)._unVal + 4) = uVar7;
    if ((pSVar4[uVar10].super_SQObject._type & 0x8000000) != 0) {
      pSVar1 = &((pSVar4[uVar10].super_SQObject._unVal.pTable)->super_SQDelegable).
                super_SQCollectable.super_SQRefCounted._uiRef;
      *pSVar1 = *pSVar1 + 1;
    }
    if ((SVar3 >> 0x1b & 1) != 0) {
      pSVar1 = &(pSVar5->super_SQDelegable).super_SQCollectable.super_SQRefCounted._uiRef;
      *pSVar1 = *pSVar1 - 1;
      if (*pSVar1 == 0) {
        (*(pSVar5->super_SQDelegable).super_SQCollectable.super_SQRefCounted._vptr_SQRefCounted[2])
                  ();
      }
    }
  }
  return (ulong)nidx < uVar11;
}

Assistant:

bool Set(const SQInteger nidx,const SQObjectPtr &val)
    {
        if((SQUnsignedInteger)nidx<(SQUnsignedInteger)_values.size()){
            _values[nidx]=val;
            VT_TRACE(nidx, val, _ss(this)->_root_vm);
            return true;
        }
        else return false;
    }